

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<bool,_bool> * __thiscall
Catch::ExprLhs<bool>::operator==
          (BinaryExpr<bool,_bool> *__return_storage_ptr__,ExprLhs<bool> *this,bool rhs)

{
  bool bVar1;
  bool bVar2;
  StringRef local_30;
  byte local_19;
  ExprLhs<bool> *pEStack_18;
  bool rhs_local;
  ExprLhs<bool> *this_local;
  
  bVar1 = this->m_lhs;
  bVar2 = this->m_lhs;
  local_19 = rhs;
  pEStack_18 = this;
  this_local = (ExprLhs<bool> *)__return_storage_ptr__;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<bool,_bool>::BinaryExpr
            (__return_storage_ptr__,(bool)(bVar1 & 1U) == rhs,(bool)(bVar2 & 1),local_30,
             (bool)(local_19 & 1));
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( bool rhs ) -> BinaryExpr<LhsT, bool> const {
            return { m_lhs == rhs, m_lhs, "==", rhs };
        }